

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_avx2_256_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_scan_avx2_256_32
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  parasail_profile_t *profile;
  parasail_result_t *ppVar1;
  
  if (s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_scan_avx2_256_32_cold_8();
  }
  else if (s2Len < 1) {
    parasail_nw_stats_rowcol_scan_avx2_256_32_cold_7();
  }
  else if (open < 0) {
    parasail_nw_stats_rowcol_scan_avx2_256_32_cold_6();
  }
  else if (gap < 0) {
    parasail_nw_stats_rowcol_scan_avx2_256_32_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_scan_avx2_256_32_cold_4();
  }
  else {
    if (matrix->type == 1) {
      if (s1 == (char *)0x0) {
        parasail_nw_stats_rowcol_scan_avx2_256_32_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (s1 == (char *)0x0) {
        parasail_nw_stats_rowcol_scan_avx2_256_32_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (s1Len < 1) {
        parasail_nw_stats_rowcol_scan_avx2_256_32_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    profile = parasail_profile_create_stats_avx_256_32(s1,s1Len,matrix);
    if (profile != (parasail_profile_t *)0x0) {
      ppVar1 = parasail_nw_stats_rowcol_scan_profile_avx2_256_32(profile,s2,s2Len,open,gap);
      parasail_profile_free(profile);
      return ppVar1;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_profile_t *profile = NULL;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(s1);
    }
    else {
        PARASAIL_CHECK_NULL(s1);
        PARASAIL_CHECK_GT0(s1Len);
    }

    /* initialize local variables */
    profile = parasail_profile_create_stats_avx_256_32(s1, s1Len, matrix);
    if (!profile) return NULL;
    result = PNAME(profile, s2, s2Len, open, gap);

    parasail_profile_free(profile);

    return result;
}